

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_lib.cc
# Opt level: O2

size_t SSL_CTX_sess_number(SSL_CTX *ctx)

{
  size_t sVar1;
  MutexReadLock lock;
  MutexLockBase<&CRYPTO_MUTEX_lock_read,_&CRYPTO_MUTEX_unlock_read> local_10;
  
  local_10.mu_ = &ctx->lock;
  CRYPTO_MUTEX_lock_read(local_10.mu_);
  sVar1 = OPENSSL_lh_num_items((_LHASH *)ctx->sessions);
  bssl::internal::MutexLockBase<&CRYPTO_MUTEX_lock_read,_&CRYPTO_MUTEX_unlock_read>::~MutexLockBase
            (&local_10);
  return sVar1;
}

Assistant:

size_t SSL_CTX_sess_number(const SSL_CTX *ctx) {
  MutexReadLock lock(const_cast<CRYPTO_MUTEX *>(&ctx->lock));
  return lh_SSL_SESSION_num_items(ctx->sessions);
}